

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O0

int __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::cmpIgnoreCase_pcp
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,StringRef *string)

{
  utf32_t uVar1;
  long *in_RSI;
  long *in_RDI;
  Result RVar2;
  Result RVar3;
  utf32_t c2;
  utf32_t c1;
  size_t i;
  size_t length;
  size_t length2;
  size_t length1;
  ConvertResult result2;
  ConvertResult result1;
  utf32_t buffer2 [64];
  utf32_t buffer1 [64];
  C *end2;
  C *p2;
  C *end1;
  C *p1;
  uint local_294;
  DstUnit *local_290;
  utf32_t in_stack_fffffffffffffd84;
  DstUnit *in_stack_fffffffffffffd88;
  DstUnit *in_stack_fffffffffffffd90;
  DstUnit *in_stack_fffffffffffffd98;
  DstUnit *in_stack_fffffffffffffda0;
  wchar_t *local_258;
  char *local_250;
  wchar_t *local_248;
  char *local_240;
  utf32_t local_238 [64];
  utf32_t local_138 [64];
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  
  local_20 = (char *)*in_RDI;
  local_28 = local_20 + in_RDI[2];
  local_30 = (char *)*in_RSI;
  local_38 = local_30 + in_RSI[2];
  do {
    if (local_28 <= local_20 || local_38 <= local_30) {
      if (local_30 < local_38) {
        local_294 = 0xffffffff;
      }
      else {
        local_294 = (uint)(local_20 < local_28);
      }
      return local_294;
    }
    RVar2 = enc::
            Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::sl::Nop<wchar_t,_wchar_t>,_axl::enc::Utf8Decoder>
            ::convert(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                      (SrcUnit *)in_stack_fffffffffffffd90,(SrcUnit *)in_stack_fffffffffffffd88,
                      in_stack_fffffffffffffd84);
    RVar3 = enc::
            Convert<axl::enc::Utf32,_axl::enc::Utf8,_axl::sl::Nop<wchar_t,_wchar_t>,_axl::enc::Utf8Decoder>
            ::convert(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                      (SrcUnit *)in_stack_fffffffffffffd90,(SrcUnit *)in_stack_fffffffffffffd88,
                      in_stack_fffffffffffffd84);
    local_248 = RVar2.m_dst;
    in_stack_fffffffffffffda0 = (DstUnit *)((long)local_248 - (long)local_138 >> 2);
    local_258 = RVar3.m_dst;
    in_stack_fffffffffffffd98 = (DstUnit *)((long)local_258 - (long)local_238 >> 2);
    local_290 = in_stack_fffffffffffffd98;
    if (in_stack_fffffffffffffda0 < in_stack_fffffffffffffd98) {
      local_290 = in_stack_fffffffffffffda0;
    }
    for (in_stack_fffffffffffffd88 = (DstUnit *)0x0; in_stack_fffffffffffffd88 < local_290;
        in_stack_fffffffffffffd88 = (DstUnit *)((long)in_stack_fffffffffffffd88 + 1)) {
      in_stack_fffffffffffffd84 = enc::toCaseFolded(local_138[(long)in_stack_fffffffffffffd88]);
      uVar1 = enc::toCaseFolded(local_238[(long)in_stack_fffffffffffffd88]);
      if (in_stack_fffffffffffffd84 < uVar1) {
        return -1;
      }
      if (uVar1 < in_stack_fffffffffffffd84) {
        return 1;
      }
    }
    local_240 = RVar2.m_src;
    local_20 = local_240;
    local_250 = RVar3.m_src;
    local_30 = local_250;
    in_stack_fffffffffffffd90 = local_290;
  } while( true );
}

Assistant:

int
	cmpIgnoreCase_pcp(const StringRef& string) const {
		typedef enc::Convert<enc::Utf32, Encoding> Convert;
		typedef enc::ConvertResult<utf32_t, C> ConvertResult;

		const C* p1 = m_p;
		const C* end1 = p1 + m_length;
		const C* p2 = string.m_p;
		const C* end2 = p2 + string.m_length;

		while (p1 < end1 && p2 < end2) {
			utf32_t buffer1[64];
			utf32_t buffer2[64];

			ConvertResult result1 = Convert::convert(buffer1, buffer1 + countof(buffer1), p1, end1);
			ConvertResult result2 = Convert::convert(buffer2, buffer2 + countof(buffer2), p2, end2);

			size_t length1 = result1.m_dst - buffer1;
			size_t length2 = result2.m_dst - buffer2;
			size_t length = AXL_MIN(length1, length2);

			for (size_t i = 0; i < length; i++) {
				utf32_t c1 = enc::toCaseFolded(buffer1[i]);
				utf32_t c2 = enc::toCaseFolded(buffer2[i]);

				if (c1 < c2)
					return -1;
				else if (c1 > c2)
					return 1;
			}

			p1 = result1.m_src;
			p2 = result2.m_src;
		}

		return
			p2 < end2 ? -1 :
			p1 < end1 ? 1 : 0;
	}